

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_mlvec.cpp
# Opt level: O3

MPP_RET vpu_api_mlvec_setup(VpuApiMlvec ctx,MppCtx mpp,MppApi *mpi,MppEncCfg enc_cfg)

{
  uint uVar1;
  undefined4 in_EAX;
  int iVar2;
  MPP_RET MVar3;
  undefined1 auVar4 [16];
  
  auVar4._0_4_ = -(uint)(ctx == (VpuApiMlvec)0x0);
  auVar4._4_4_ = -(uint)(mpp == (MppCtx)0x0);
  auVar4._8_4_ = -(uint)(mpi == (MppApi *)0x0);
  auVar4._12_4_ = -(uint)(enc_cfg == (MppEncCfg)0x0);
  iVar2 = movmskps(in_EAX,auVar4);
  if (iVar2 == 0) {
    if ((vpu_api_debug & 0x10000) == 0) {
      *(MppCtx *)ctx = mpp;
      *(MppApi **)((long)ctx + 8) = mpi;
      *(MppEncCfg *)((long)ctx + 0x10) = enc_cfg;
      MVar3 = MPP_OK;
    }
    else {
      MVar3 = MPP_OK;
      _mpp_log_l(4,"vpu_api_mlvec","enter %p\n","vpu_api_mlvec_setup",ctx);
      uVar1 = vpu_api_debug >> 0x10;
      *(MppCtx *)ctx = mpp;
      *(MppApi **)((long)ctx + 8) = mpi;
      *(MppEncCfg *)((long)ctx + 0x10) = enc_cfg;
      if ((uVar1 & 1) != 0) {
        MVar3 = MPP_OK;
        _mpp_log_l(4,"vpu_api_mlvec","leave %p\n","vpu_api_mlvec_setup",ctx);
      }
    }
  }
  else {
    _mpp_log_l(2,"vpu_api_mlvec","invalid NULL input ctx %p mpp %p mpi %p cfg %p\n",
               "vpu_api_mlvec_setup",ctx,mpp,mpi,enc_cfg);
    MVar3 = MPP_ERR_NULL_PTR;
  }
  return MVar3;
}

Assistant:

MPP_RET vpu_api_mlvec_setup(VpuApiMlvec ctx, MppCtx mpp, MppApi *mpi, MppEncCfg enc_cfg)
{
    if (NULL == ctx || NULL == mpp || NULL == mpi || NULL == enc_cfg) {
        mpp_err_f("invalid NULL input ctx %p mpp %p mpi %p cfg %p\n",
                  ctx, mpp, mpi, enc_cfg);
        return MPP_ERR_NULL_PTR;
    }

    mlvec_dbg_func("enter %p\n", ctx);

    VpuApiMlvecImpl *impl = (VpuApiMlvecImpl *)ctx;
    impl->mpp = mpp;
    impl->mpi = mpi;
    impl->enc_cfg = enc_cfg;

    mlvec_dbg_func("leave %p\n", ctx);

    return MPP_OK;
}